

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

SN_ELEMENT * __thiscall
ON_SerialNumberMap::AddSerialNumberAndId(ON_SerialNumberMap *this,ON__UINT64 sn,ON_UUID id)

{
  bool bVar1;
  ON__UINT32 OVar2;
  SN_ELEMENT *pSVar3;
  SN_ELEMENT *pSVar4;
  SN_ELEMENT **ppSVar5;
  ON_UUID OVar6;
  ON__UINT32 hash_i;
  SN_ELEMENT **hash_table_block;
  uchar local_58 [8];
  bool local_3d;
  ON__UINT32 local_3c;
  bool bNewId;
  ON__UINT32 id_crc32;
  SN_ELEMENT *e;
  ON__UINT64 sn_local;
  ON_SerialNumberMap *this_local;
  ON_UUID id_local;
  
  id_local._0_8_ = id.Data4;
  this_local = id._0_8_;
  pSVar3 = AddSerialNumber(this,sn);
  if ((pSVar3 != (SN_ELEMENT *)0x0) && (pSVar3->m_id_active == '\0')) {
    local_3c = 0;
    local_3d = IdIsNil((ON_UUID *)&this_local);
    if (!local_3d) {
      local_3c = IdCRC32((ON_UUID *)&this_local);
      bVar1 = IdIsEqual(&this->m_inactive_id,(ON_UUID *)&this_local);
      if (bVar1) {
        (this->m_inactive_id).Data1 = 0;
        (this->m_inactive_id).Data2 = 0;
        (this->m_inactive_id).Data3 = 0;
        (this->m_inactive_id).Data4[0] = '\0';
        (this->m_inactive_id).Data4[1] = '\0';
        (this->m_inactive_id).Data4[2] = '\0';
        (this->m_inactive_id).Data4[3] = '\0';
        (this->m_inactive_id).Data4[4] = '\0';
        (this->m_inactive_id).Data4[5] = '\0';
        (this->m_inactive_id).Data4[6] = '\0';
        (this->m_inactive_id).Data4[7] = '\0';
      }
      else if ((this->m_active_id_count != 0) &&
              (OVar6.Data4 = (uchar  [8])id_local._0_8_, OVar6._0_8_ = this_local,
              pSVar4 = Internal_HashTableFindId(this,OVar6,local_3c,true),
              pSVar4 != (SN_ELEMENT *)0x0)) {
        local_3d = true;
      }
    }
    if (local_3d != false) {
      OVar6 = ON_CreateId();
      hash_table_block = OVar6._0_8_;
      this_local = (ON_SerialNumberMap *)hash_table_block;
      local_58 = OVar6.Data4;
      id_local._0_8_ = local_58;
      local_3c = IdCRC32((ON_UUID *)&this_local);
    }
    if (this->m_bHashTableIsValid != '\0') {
      Internal_HashTableGrow(this);
      ppSVar5 = Internal_HashTableBlock(this,local_3c);
      OVar2 = Internal_HashTableBlockRowIndex(local_3c);
      pSVar3->m_next = ppSVar5[OVar2];
      ppSVar5[OVar2] = pSVar3;
    }
    *(ON_SerialNumberMap **)&pSVar3->m_id = this_local;
    *(undefined8 *)(pSVar3->m_id).Data4 = id_local._0_8_;
    pSVar3->m_id_active = '\x01';
    pSVar3->m_id_crc32 = local_3c;
    this->m_active_id_count = this->m_active_id_count + 1;
  }
  return pSVar3;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::AddSerialNumberAndId(ON__UINT64 sn,ON_UUID id)
{
  struct SN_ELEMENT* e = AddSerialNumber(sn);

  if (nullptr == e || 0 != e->m_id_active)
  {
    // There was an active element with serial number = sn
    return e;
  }
  
  ON__UINT32 id_crc32 = 0;

  bool bNewId = IdIsNil(&id);
  if ( false == bNewId )
  {
    id_crc32 = IdCRC32(&id);
    if (IdIsEqual(&m_inactive_id, &id))
    {
      // This id was recently removed and is now being added back
      // (which turns out to be a common occurrence - go figure).
      // No need to check for duplicates.
      m_inactive_id = ON_nil_uuid;
    }
    else if (m_active_id_count > 0)
    {
      if (nullptr != Internal_HashTableFindId(id, id_crc32, true))
        bNewId = true; // id is in use - make a new one
    }
  }

  if ( bNewId )
  {
    // The input id is nil or in use. Create a new id. No need to check for duplicates
    id = ON_CreateId();
    id_crc32 = IdCRC32(&id);
  }

  if (m_bHashTableIsValid)
  {
    // Growing must happen vefore e->m_id* values are set.
    Internal_HashTableGrow();

    // Add id to hash table
    struct SN_ELEMENT** hash_table_block = Internal_HashTableBlock(id_crc32);
    const ON__UINT32 hash_i = ON_SerialNumberMap::Internal_HashTableBlockRowIndex(id_crc32);
    e->m_next = hash_table_block[hash_i];
    hash_table_block[hash_i] = e;
  }
  
  // e->m_id and related setting must be initialized after any
  // possible calls to Internal_HashTableGrow() to prevent add
  // e twice.
  e->m_id = id;
  e->m_id_active = 1;
  e->m_id_crc32 = id_crc32;
  m_active_id_count++;

  return e;
}